

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_config_matches(ssl_primary_config *data,ssl_primary_config *needle)

{
  curl_blob *pcVar1;
  curl_blob *pcVar2;
  int iVar3;
  
  if (((data->version == needle->version) && (data->version_max == needle->version_max)) &&
     (((needle->field_0x60 ^ data->field_0x60) & 7) == 0)) {
    pcVar1 = data->cert_blob;
    pcVar2 = needle->cert_blob;
    if (((pcVar1 == (curl_blob *)0x0 && pcVar2 == (curl_blob *)0x0) ||
        (((pcVar1 != (curl_blob *)0x0 && pcVar2 != (curl_blob *)0x0 && (pcVar1->len == pcVar2->len))
         && (iVar3 = bcmp(pcVar1->data,pcVar2->data,pcVar1->len), iVar3 == 0)))) &&
       (((iVar3 = Curl_safe_strcasecompare(data->CApath,needle->CApath), iVar3 != 0 &&
         (iVar3 = Curl_safe_strcasecompare(data->CAfile,needle->CAfile), iVar3 != 0)) &&
        (((iVar3 = Curl_safe_strcasecompare(data->clientcert,needle->clientcert), iVar3 != 0 &&
          ((((iVar3 = Curl_safe_strcasecompare(data->random_file,needle->random_file), iVar3 != 0 &&
             (iVar3 = Curl_safe_strcasecompare(data->egdsocket,needle->egdsocket), iVar3 != 0)) &&
            (iVar3 = Curl_safe_strcasecompare(data->cipher_list,needle->cipher_list), iVar3 != 0))
           && ((iVar3 = Curl_safe_strcasecompare(data->cipher_list13,needle->cipher_list13),
               iVar3 != 0 &&
               (iVar3 = Curl_safe_strcasecompare(data->curves,needle->curves), iVar3 != 0)))))) &&
         (iVar3 = Curl_safe_strcasecompare(data->pinned_key,needle->pinned_key), iVar3 != 0)))))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_primary_config *data,
                        struct ssl_primary_config *needle)
{
  if((data->version == needle->version) &&
     (data->version_max == needle->version_max) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     (data->verifystatus == needle->verifystatus) &&
     blobcmp(data->cert_blob, needle->cert_blob) &&
     Curl_safe_strcasecompare(data->CApath, needle->CApath) &&
     Curl_safe_strcasecompare(data->CAfile, needle->CAfile) &&
     Curl_safe_strcasecompare(data->clientcert, needle->clientcert) &&
     Curl_safe_strcasecompare(data->random_file, needle->random_file) &&
     Curl_safe_strcasecompare(data->egdsocket, needle->egdsocket) &&
     Curl_safe_strcasecompare(data->cipher_list, needle->cipher_list) &&
     Curl_safe_strcasecompare(data->cipher_list13, needle->cipher_list13) &&
     Curl_safe_strcasecompare(data->curves, needle->curves) &&
     Curl_safe_strcasecompare(data->pinned_key, needle->pinned_key))
    return TRUE;

  return FALSE;
}